

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O2

Var __thiscall ScriptMemoryDumper::Dump(ScriptMemoryDumper *this)

{
  Recycler *pRVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  
  pRVar1 = this->scriptContext->recycler;
  uVar3 = 0;
  for (sVar5 = 0x10; sVar5 != 0x310; sVar5 = sVar5 + 0x10) {
    (this->current).totalByteCount = 0;
    *(undefined8 *)&(this->current).finalizeCount = 0;
    *(undefined8 *)&(this->current).activeObjectCount = 0;
    (this->current).activeObjectByteSize = 0;
    (this->current).pageCount = 0;
    (this->current).objectSize = 0;
    (this->current).freeObjectCount = 0;
    uVar2 = Memory::HeapInfo::GetBucketIndex(sVar5);
    DumpHeapBucket<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
              (this,uVar3,
               &(pRVar1->autoHeap).defaultHeap.heapBuckets[uVar2].leafHeapBucket.
                super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>);
    uVar2 = Memory::HeapInfo::GetBucketIndex(sVar5);
    DumpHeapBucket<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
              (this,uVar3,
               (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
               ((pRVar1->autoHeap).defaultHeap.heapBuckets + uVar2));
    uVar2 = Memory::HeapInfo::GetBucketIndex(sVar5);
    DumpHeapBucket<SmallAllocationBlockAttributes>
              (this,uVar3,&(pRVar1->autoHeap).defaultHeap.heapBuckets[uVar2].finalizableHeapBucket);
    SaveCurrentAtIndex(this,uVar3);
    MergeCurrentStats(this);
    uVar3 = uVar3 + 1;
  }
  sVar5 = 0x310;
  lVar4 = 0;
  while( true ) {
    (this->current).totalByteCount = 0;
    *(undefined8 *)&(this->current).finalizeCount = 0;
    *(undefined8 *)&(this->current).activeObjectCount = 0;
    (this->current).activeObjectByteSize = 0;
    (this->current).pageCount = 0;
    (this->current).objectSize = 0;
    (this->current).freeObjectCount = 0;
    if (lVar4 == 0x1d) break;
    uVar3 = Memory::HeapInfo::GetMediumBucketIndex(sVar5);
    uVar2 = (uint)lVar4;
    DumpHeapBucket<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
              (this,uVar2,
               &(pRVar1->autoHeap).defaultHeap.mediumHeapBuckets[uVar3].leafHeapBucket.
                super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>);
    uVar3 = Memory::HeapInfo::GetMediumBucketIndex(sVar5);
    DumpHeapBucket<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
              (this,uVar2,
               (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *)
               ((pRVar1->autoHeap).defaultHeap.mediumHeapBuckets + uVar3));
    uVar3 = Memory::HeapInfo::GetMediumBucketIndex(sVar5);
    DumpHeapBucket<MediumAllocationBlockAttributes>
              (this,uVar2,
               &(pRVar1->autoHeap).defaultHeap.mediumHeapBuckets[uVar3].finalizableHeapBucket);
    SaveCurrentAtIndex(this,uVar2 + 0x30);
    MergeCurrentStats(this);
    sVar5 = sVar5 + 0x10;
    lVar4 = lVar4 + 1;
  }
  DumpLargeBucket(this,&(pRVar1->autoHeap).defaultHeap.largeObjectBucket);
  SaveCurrentAsLargeBlock(this);
  MergeCurrentStats(this);
  SaveSummary(this);
  return this->dumpObject;
}

Assistant:

Js::Var ScriptMemoryDumper::Dump()
{
    Recycler* recycler = scriptContext->GetRecycler();
    HeapInfo* heapInfo = recycler->GetDefaultHeapInfo();

    for (uint32 i = 0 ; i < HeapConstants::BucketCount; i++)
    {
        ResetCurrentStats();
        size_t sizeCat = (i + 1) * HeapConstants::ObjectGranularity;
        DumpHeapBucket(i, &heapInfo->GetBucket<LeafBit>(sizeCat));
        DumpHeapBucket(i, &heapInfo->GetBucket<NoBit>(sizeCat));
        DumpHeapBucket(i, (SmallFinalizableHeapBucket *)&heapInfo->GetBucket<FinalizeBit>(sizeCat));
        SaveCurrentAtIndex(i);
        MergeCurrentStats();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint32 i = 0 ; i < HeapConstants::MediumBucketCount; i++)
    {
        ResetCurrentStats();
        size_t sizeCat = HeapConstants::MaxSmallObjectSize + ((i + 1) * HeapConstants::ObjectGranularity);

#if SMALLBLOCK_MEDIUM_ALLOC
        DumpHeapBucket(i, &heapInfo->GetMediumBucket<LeafBit>(sizeCat));
        DumpHeapBucket(i, &heapInfo->GetMediumBucket<NoBit>(sizeCat));
        DumpHeapBucket(i, (MediumFinalizableHeapBucket *)&heapInfo->GetMediumBucket<FinalizeBit>(sizeCat));
#else
        DumpLargeBucket(&heapInfo->GetMediumBucket(sizeCat));
#endif
        SaveCurrentAtIndex(i + HeapConstants::BucketCount);
        MergeCurrentStats();
    }
#endif

    ResetCurrentStats();
    DumpLargeBucket(&heapInfo->largeObjectBucket);
    SaveCurrentAsLargeBlock();
    MergeCurrentStats();
    SaveSummary();
    return dumpObject;
}